

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939spy.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined3 uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  cmsghdr *__cmsg;
  tm *ptVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  undefined8 uVar16;
  uint uVar17;
  char cVar18;
  size_t local_a8;
  ulong uStack_a0;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  j1939_filter filt;
  uint64_t dst_name;
  sockaddr_can src;
  
  iVar2 = s.time;
LAB_001025a4:
  do {
    while (s.time = iVar2, iVar2 = getopt_long(argc,argv,"vPb:t::?",long_opts,0), iVar2 < 0x62) {
      if (iVar2 != 0x50) {
        if (iVar2 != -1) {
LAB_00102c16:
          fputs("j1939spy: An SAE J1939 spy utility\nUsage: j1939spy [OPTION...] [[IFACE:][NAME|SA][,PGN]]\nOptions:\n  -P, --promisc\t\tRun in promiscuous mode\n\t\t\t(= receive traffic not for this ECU)\n  -b, --block=SIZE\tUse a receive buffer of SIZE (default 1024)\n  -t, --time[=a|d|z|A]\tShow time: (a)bsolute, (d)elta, (z)ero, (A)bsolute w date\n"
                ,_stderr);
          exit(1);
        }
        pcVar14 = argv[_optind];
        if ((pcVar14 != (char *)0x0) &&
           (_optarg = pcVar14, iVar2 = libj1939_str2addr(pcVar14,(char **)0x0,&s.addr), iVar2 < 0))
        {
          pcVar15 = "bad URI %s";
          uVar16 = 0;
          pcVar14 = _optarg;
LAB_00102c8d:
          err(uVar16,pcVar15,pcVar14);
        }
        iVar2 = s.pkt_len;
        buf = (uint8_t *)malloc((long)s.pkt_len);
        if (buf == (uint8_t *)0x0) {
          pcVar14 = "malloc %u";
          uVar16 = 1;
          goto LAB_00102c0f;
        }
        iVar2 = socket(0x1d,2,7);
        if (iVar2 < 0) {
          pcVar14 = "socket(can, dgram, j1939)";
        }
        else {
          filt.pgn = 0;
          filt.pgn_mask = 0;
          filt.addr = '\0';
          filt.addr_mask = '\0';
          filt._26_6_ = 0;
          filt.name = 0;
          filt.name_mask = 0;
          cVar18 = s.addr.can_addr.j1939.name != 0;
          if ((bool)cVar18) {
            filt.name = s.addr.can_addr.j1939.name;
            filt.name_mask = 0xffffffffffffffff;
          }
          if (s.addr.can_addr.j1939.addr != 0xff) {
            filt.addr_mask = 0xff;
            filt.addr = s.addr.can_addr.j1939.addr;
            filt._26_6_ = 0;
            cVar18 = cVar18 + '\x01';
          }
          if (s.addr.can_addr.j1939.pgn < 0x40000) {
            filt.pgn_mask = 0xffffffff;
            filt.pgn = s.addr.can_addr.j1939.pgn;
            cVar18 = '\x01';
          }
          if ((cVar18 == '\0') || (iVar3 = setsockopt(iVar2,0x6b,1,&filt,0x20), -1 < iVar3)) {
            if ((s.promisc == 0) || (iVar3 = setsockopt(iVar2,0x6b,2,&ival_1,4), -1 < iVar3)) {
              if ((s.time == 0) || (iVar3 = setsockopt(iVar2,1,0x1d,&ival_1,4), -1 < iVar3)) {
                iVar3 = setsockopt(iVar2,1,8,&s.pkt_len,4);
                if (iVar3 < 0) {
                  pcVar14 = "setsockopt rcvbuf %u";
                  iVar2 = s.pkt_len;
                  goto LAB_00102c0a;
                }
                src._0_8_ = (ulong)(uint)s.addr.can_ifindex << 0x20;
                src.can_family = 0x1d;
                src.can_addr.j1939.name = 0;
                src.can_addr._8_8_ = 0xff00040000;
                iVar3 = bind(iVar2,(sockaddr *)&src,0x18);
                if (iVar3 < 0) {
                  pcVar15 = "bind(%s)";
                  uVar16 = 1;
                  pcVar14 = argv[1];
                  goto LAB_00102c8d;
                }
                iov.iov_base = buf;
                msg.msg_iov = &iov;
                msg.msg_iovlen = 1;
                msg.msg_control = ctrlmsg;
                local_90 = 0;
                local_98 = 0;
                msg.msg_name = &src;
                goto LAB_00102854;
              }
              pcVar14 = "setsockopt timestamp";
            }
            else {
              pcVar14 = "setsockopt promisc";
            }
          }
          else {
            pcVar14 = "setsockopt filter";
          }
        }
        err(1,pcVar14);
      }
      s.promisc = s.promisc + 1;
      iVar2 = s.time;
    }
    if (iVar2 != 0x74) {
      if (iVar2 != 0x62) goto LAB_00102c16;
      uVar4 = strtoul(_optarg,(char **)0x0,0);
      s.pkt_len = (int)uVar4;
      iVar2 = s.time;
      goto LAB_001025a4;
    }
    if (_optarg == (char *)0x0) {
      s.time = 0x7a;
      iVar2 = s.time;
      goto LAB_001025a4;
    }
    iVar2 = (int)*_optarg;
    pvVar5 = memchr("adzA",iVar2,5);
  } while (pvVar5 != (void *)0x0);
  pcVar14 = "unknown time option \'%c\'";
  uVar16 = 1;
  goto LAB_00102c0f;
  while( true ) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) break;
LAB_00102854:
    iov.iov_len = (size_t)s.pkt_len;
    msg.msg_namelen = 0x18;
    msg.msg_controllen = 0x68;
    msg.msg_flags = 0;
    uVar4 = recvmsg(iVar2,(msghdr *)&msg,0);
    uVar17 = (uint)uVar4;
    if (-1 < (int)uVar17) {
      uVar11 = 0;
      uVar10 = 0;
      __cmsg = (cmsghdr *)0x0;
      if (0xf < msg.msg_controllen) {
        __cmsg = (cmsghdr *)msg.msg_control;
      }
      uVar8 = 0;
      cmsg = __cmsg;
      if (__cmsg != (cmsghdr *)0x0) {
        uVar11 = 0;
        local_88 = 0;
        local_80 = 0;
        do {
          cmsg = __cmsg;
          if (((cmsghdr *)__cmsg)->cmsg_level == 0x6b) {
            uVar10 = ((cmsghdr *)__cmsg)->cmsg_type;
            uVar11 = uVar11 | 1L << ((ulong)uVar10 & 0x3f);
            uVar1 = (undefined3)(uVar10 >> 8);
            if (uVar10 == 3) {
              local_80 = (ulong)CONCAT31(uVar1,(char)((cmsghdr *)__cmsg)[1].cmsg_len);
            }
            else if (uVar10 == 2) {
              memcpy(&dst_name,(cmsghdr *)__cmsg + 1,((cmsghdr *)__cmsg)->cmsg_len - 0x10);
            }
            else if (uVar10 == 1) {
              local_88 = (ulong)CONCAT31(uVar1,(char)((cmsghdr *)__cmsg)[1].cmsg_len);
            }
          }
          else if ((((cmsghdr *)__cmsg)->cmsg_level == 1) &&
                  (((cmsghdr *)__cmsg)->cmsg_type == 0x1d)) {
            local_a8 = ((cmsghdr *)__cmsg)[1].cmsg_len;
            uStack_a0._0_4_ = ((cmsghdr *)__cmsg)[1].cmsg_level;
            uStack_a0._4_4_ = ((cmsghdr *)__cmsg)[1].cmsg_type;
            uVar11 = uVar11 | 1L << ((ulong)(byte)((cmsghdr *)__cmsg)->cmsg_type & 0x3f);
          }
          uVar10 = (uint)uVar11;
          __cmsg = (cmsghdr *)__cmsg_nxthdr((msghdr *)&msg,(cmsghdr *)__cmsg);
        } while (__cmsg != (cmsghdr *)0x0);
        uVar8 = (uint)(byte)local_88;
        uVar11 = local_80 & 0xff;
        cmsg = (cmsghdr *)0x0;
      }
      local_80 = CONCAT44(local_80._4_4_,uVar8);
      if ((uVar10 >> 0x1d & 1) != 0) {
        if (s.time < 100) {
          if (s.time == 0x41) {
            ptVar7 = localtime((time_t *)&local_a8);
            local_88 = (ulong)(uint)ptVar7->tm_sec;
            printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",(ulong)(ptVar7->tm_year + 0x76c),
                   (ulong)(ptVar7->tm_mon + 1),(ulong)(uint)ptVar7->tm_mday,
                   (ulong)(uint)ptVar7->tm_hour,(ulong)(uint)ptVar7->tm_min,local_88,uStack_a0 / 100
                  );
          }
          else if (s.time == 0x61) goto LAB_00102aca;
        }
        else {
          if (s.time == 100) {
            lVar9 = local_a8 - local_98;
            uVar13 = uStack_a0 - local_90;
            uVar12 = uVar13 + 1000000;
            if (-1 < (long)uVar13) {
              uVar12 = uVar13;
            }
            local_90 = uStack_a0;
            local_98 = local_a8;
            local_a8 = ((long)uVar13 >> 0x3f) + lVar9;
            uStack_a0 = uVar12;
          }
          else {
            if (s.time != 0x7a) goto LAB_00102af6;
            if (local_98 == 0) {
              local_98 = local_a8;
              local_90 = uStack_a0;
            }
            uVar12 = uStack_a0 - local_90;
            local_a8 = ((long)uVar12 >> 0x3f) + (local_a8 - local_98);
            uStack_a0 = uVar12 + 1000000;
            if (-1 < (long)uVar12) {
              uStack_a0 = uVar12;
            }
          }
LAB_00102aca:
          printf("(%llu.%04llu)",local_a8,uStack_a0 / 100);
        }
      }
LAB_00102af6:
      pcVar14 = libj1939_addr2str(&src);
      printf(" %s ",pcVar14);
      if ((uVar10 & 4) == 0) {
        if ((uVar10 & 2) == 0) {
          printf("- ");
        }
        else {
          printf("%02x ",local_80 & 0xffffffff);
        }
      }
      else {
        printf("%016llx ",dst_name);
      }
      printf("!%u ",uVar11);
      pcVar14 = "...";
      if ((msg.msg_flags & 0x20U) == 0) {
        pcVar14 = "";
      }
      printf("[%i%s]",uVar4 & 0xffffffff,pcVar14);
      if (uVar17 != 0) {
        uVar11 = 0;
        do {
          putchar(0x20);
          if ((uint)uVar11 < uVar17) {
            uVar10 = (uint)uVar11 + 4;
            uVar12 = (ulong)uVar10;
            if (uVar17 <= uVar10) {
              uVar12 = uVar4 & 0xffffffff;
            }
            uVar11 = uVar11 & 0xffffffff;
            do {
              printf("%02x",(ulong)buf[uVar11]);
              uVar11 = uVar11 + 1;
            } while (uVar11 < uVar12);
          }
        } while ((uint)uVar11 < uVar17);
      }
      putchar(10);
      goto LAB_00102854;
    }
  }
  iVar2 = s.addr.can_ifindex;
  if (*piVar6 == 100) {
    pcVar14 = "ifindex %i";
    uVar16 = 0;
  }
  else {
    pcVar14 = "recvmsg(ifindex %i)";
LAB_00102c0a:
    uVar16 = 1;
  }
LAB_00102c0f:
  err(uVar16,pcVar14,iVar2);
}

Assistant:

int main(int argc, char **argv)
{
	int ret, sock, opt;
	unsigned int j, len;
	struct timeval tref, tdut, ttmp;
	struct sockaddr_can src;
	struct j1939_filter filt;
	int filter = 0;
	uint8_t priority, dst_addr;
	uint64_t dst_name;
	uint64_t recvflags;

	/* argument parsing */
	while ((opt = getopt_long(argc, argv, optstring, long_opts, NULL)) != -1)
		switch (opt) {
		case 'b':
			s.pkt_len = strtoul(optarg, 0, 0);
			break;
		case 'P':
			++s.promisc;
			break;
		case 't':
			if (optarg) {
				if (!strchr("adzA", optarg[0]))
					err(1, "unknown time option '%c'",
					    optarg[0]);
				s.time = optarg[0];
			} else {
				s.time = 'z';
			}
			break;
		default:
			fputs(help_msg, stderr);
			exit(1);
			break;
		}

	if (argv[optind]) {
		optarg = argv[optind];
		ret = libj1939_str2addr(optarg, 0, &s.addr);
		if (ret < 0) {
			err(0, "bad URI %s", optarg);
			return 1;
		}
	}

	buf = malloc(s.pkt_len);
	if (!buf)
		err(1, "malloc %u", s.pkt_len);

	/* setup socket */
	sock = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (sock < 0)
		err(1, "socket(can, dgram, j1939)");

	memset(&filt, 0, sizeof(filt));
	if (s.addr.can_addr.j1939.name) {
		filt.name = s.addr.can_addr.j1939.name;
		filt.name_mask = ~0ULL;
		++filter;
	}
	if (s.addr.can_addr.j1939.addr < 0xff) {
		filt.addr = s.addr.can_addr.j1939.addr;
		filt.addr_mask = ~0;
		++filter;
	}
	if (s.addr.can_addr.j1939.pgn <= J1939_PGN_MAX) {
		filt.pgn = s.addr.can_addr.j1939.pgn;
		filt.pgn_mask = ~0;
		++filter;
	}
	if (filter) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &filt, sizeof(filt));
		if (ret < 0)
			err(1, "setsockopt filter");
	}

	if (s.promisc) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_PROMISC, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt promisc");
	}

	if (s.time) {
		ret = setsockopt(sock, SOL_SOCKET, SO_TIMESTAMP, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt timestamp");
	}
	ret = setsockopt(sock, SOL_SOCKET, SO_RCVBUF, &s.pkt_len, sizeof(s.pkt_len));
	if (ret < 0)
		err(1, "setsockopt rcvbuf %u", s.pkt_len);

	/* bind(): to default, only ifindex is used. */
	memset(&src, 0, sizeof(src));
	src.can_ifindex = s.addr.can_ifindex;
	src.can_family = AF_CAN;
	src.can_addr.j1939.name = J1939_NO_NAME;
	src.can_addr.j1939.addr = J1939_NO_ADDR;
	src.can_addr.j1939.pgn = J1939_NO_PGN;
	ret = bind(sock, (void *)&src, sizeof(src));
	if (ret < 0)
		err(1, "bind(%s)", argv[1]);

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &buf[0];
	msg.msg_name = &src;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	memset(&tref, 0, sizeof(tref));
	while (1) {
		/* these settings may be modified by recvmsg() */
		iov.iov_len = s.pkt_len;
		msg.msg_namelen = sizeof(src);
		msg.msg_controllen = sizeof(ctrlmsg);
		msg.msg_flags = 0;

		ret = recvmsg(sock, &msg, 0);
		//ret = recvfrom(buf, s.pkt_len, 0, (void *)&addr, &len);
		if (ret < 0) {
			switch (errno) {
			case ENETDOWN:
				err(0, "ifindex %i", s.addr.can_ifindex);
				continue;
			case EINTR:
				continue;
			default:
				err(1, "recvmsg(ifindex %i)", s.addr.can_ifindex);
				break;
			}
		}
		len = ret;
		recvflags = 0;
		dst_addr = 0;
		priority = 0;
		for (cmsg = CMSG_FIRSTHDR(&msg); cmsg; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
			switch (cmsg->cmsg_level) {
			case SOL_SOCKET:
				if (cmsg->cmsg_type == SCM_TIMESTAMP) {
					memcpy(&tdut, CMSG_DATA(cmsg), sizeof(tdut));
					recvflags |= 1ULL << cmsg->cmsg_type;
				}
				break;
			case SOL_CAN_J1939:
				recvflags |= 1ULL << cmsg->cmsg_type;
				if (cmsg->cmsg_type == SCM_J1939_DEST_ADDR)
					dst_addr = *CMSG_DATA(cmsg);
				else if (cmsg->cmsg_type == SCM_J1939_DEST_NAME)
					memcpy(&dst_name, CMSG_DATA(cmsg), cmsg->cmsg_len - CMSG_LEN(0));
				else if (cmsg->cmsg_type == SCM_J1939_PRIO)
					priority = *CMSG_DATA(cmsg);
				break;
			}

		}
		if (recvflags & (1ULL << SCM_TIMESTAMP)) {
			if ('z' == s.time) {
				if (!tref.tv_sec)
					tref = tdut;
				timersub(&tdut, &tref, &ttmp);
				tdut = ttmp;
				goto abs_time;
			} else if ('d' == s.time) {
				timersub(&tdut, &tref, &ttmp);
				tref = tdut;
				tdut = ttmp;
				goto abs_time;
			} else if ('a' == s.time) {
abs_time:
				printf("(%llu.%04llu)", (unsigned long long)tdut.tv_sec, (unsigned long long)tdut.tv_usec / 100);
			} else if ('A' == s.time) {
				struct tm tm;
				tm = *localtime(&tdut.tv_sec);
				printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",
					tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday,
					tm.tm_hour, tm.tm_min, tm.tm_sec,
					(unsigned long long)tdut.tv_usec/100);
			}
		}
		printf(" %s ", libj1939_addr2str(&src));
		if (recvflags & (1ULL << SCM_J1939_DEST_NAME))
			printf("%016llx ", (unsigned long long)dst_name);
		else if (recvflags & (1ULL << SCM_J1939_DEST_ADDR))
			printf("%02x ", dst_addr);
		else
			printf("- ");
		printf("!%u ", priority);

		printf("[%i%s]", len, (msg.msg_flags & MSG_TRUNC) ? "..." : "");
		for (j = 0; j < len;) {
			unsigned int end = j + 4;
			if (end > len)
				end = len;
			printf(" ");
			for (; j < end; ++j)
				printf("%02x", buf[j]);
		}
		printf("\n");
	}

	free(buf);
	return 0;
}